

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# openssl.c
# Opt level: O3

int gen_publickey_from_rsa_evp
              (LIBSSH2_SESSION *session,uchar **method,size_t *method_len,uchar **pubkeydata,
              size_t *pubkeydata_len,EVP_PKEY *pk)

{
  int iVar1;
  int iVar2;
  int iVar3;
  rsa_st *r;
  uchar *puVar4;
  uchar *buf;
  uchar *puVar5;
  BIGNUM *n;
  BIGNUM *e;
  BIGNUM *local_40;
  BIGNUM *local_38;
  
  r = EVP_PKEY_get1_RSA((EVP_PKEY *)pk);
  if (r != (rsa_st *)0x0) {
    puVar4 = (uchar *)(*session->alloc)(7,&session->abstract);
    if (puVar4 == (uchar *)0x0) {
      RSA_free(r);
    }
    else {
      RSA_get0_key(r,&local_40,&local_38,0);
      iVar1 = BN_num_bits(local_38);
      iVar3 = iVar1 + 0xe;
      if (-1 < iVar1 + 7) {
        iVar3 = iVar1 + 7;
      }
      iVar2 = BN_num_bits(local_40);
      iVar1 = iVar2 + 0xe;
      if (-1 < iVar2 + 7) {
        iVar1 = iVar2 + 7;
      }
      buf = (uchar *)(*session->alloc)((long)((iVar3 >> 3) + (iVar1 >> 3) + 0x15),&session->abstract
                                      );
      if (buf != (uchar *)0x0) {
        _libssh2_htonu32(buf,7);
        builtin_memcpy(buf + 4,"ssh-rsa",7);
        puVar5 = write_bn(buf + 0xb,(BIGNUM *)local_38,(iVar3 >> 3) + 1);
        puVar5 = write_bn(puVar5,(BIGNUM *)local_40,(iVar1 >> 3) + 1);
        RSA_free(r);
        builtin_memcpy(puVar4,"ssh-rsa",7);
        *method = puVar4;
        *method_len = 7;
        *pubkeydata = buf;
        *pubkeydata_len = (long)puVar5 - (long)buf;
        return 0;
      }
      RSA_free(r);
      (*session->free)(puVar4,&session->abstract);
    }
  }
  iVar3 = _libssh2_error(session,-6,"Unable to allocate memory for private key data");
  return iVar3;
}

Assistant:

static int
gen_publickey_from_rsa_evp(LIBSSH2_SESSION *session,
                           unsigned char **method,
                           size_t *method_len,
                           unsigned char **pubkeydata,
                           size_t *pubkeydata_len,
                           EVP_PKEY *pk)
{
    RSA*           rsa = NULL;
    unsigned char* key;
    unsigned char* method_buf = NULL;
    size_t  key_len;

    _libssh2_debug(session,
                   LIBSSH2_TRACE_AUTH,
                   "Computing public key from RSA private key envelop");

    rsa = EVP_PKEY_get1_RSA(pk);
    if (rsa == NULL) {
        /* Assume memory allocation error... what else could it be ? */
        goto __alloc_error;
    }

    method_buf = LIBSSH2_ALLOC(session, 7);  /* ssh-rsa. */
    if (method_buf == NULL) {
        goto __alloc_error;
    }

    key = gen_publickey_from_rsa(session, rsa, &key_len);
    if (key == NULL) {
        goto __alloc_error;
    }
    RSA_free(rsa);

    memcpy(method_buf, "ssh-rsa", 7);
    *method         = method_buf;
    *method_len     = 7;
    *pubkeydata     = key;
    *pubkeydata_len = key_len;
    return 0;

  __alloc_error:
    if (rsa != NULL) {
        RSA_free(rsa);
    }
    if (method_buf != NULL) {
        LIBSSH2_FREE(session, method_buf);
    }

    return _libssh2_error(session,
                          LIBSSH2_ERROR_ALLOC,
                          "Unable to allocate memory for private key data");
}